

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall AnalogConsumer::initialize(AnalogConsumer *this)

{
  reference pvVar1;
  value_type_conflict2 *pvVar2;
  HFSubConsumer *in_RDI;
  uint8_t m;
  int bit;
  size_t i;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  string *__x;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  const_iterator in_stack_ffffffffffffffd8;
  value_type_conflict2 *__x_00;
  value_type_conflict2 *pvVar4;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::front
                     ((vector<int,_std::allocator<int>_> *)in_RDI);
  *(value_type *)&in_RDI[1].super_HighFreqSub._vptr_HighFreqSub = *pvVar1;
  __x = &in_RDI[1].super_HighFreqSub.dt.dataFormat;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffffb8);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,
                      CONCAT13(in_stack_ffffffffffffffd3,
                               CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0))),
             in_stack_ffffffffffffffd8);
  __x_00 = (value_type_conflict2 *)0x0;
  while (pvVar4 = __x_00,
        pvVar2 = (value_type_conflict2 *)
                 std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RDI[1].super_HighFreqSub.dt.dataFormat), __x_00 < pvVar2) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[1].super_HighFreqSub.dt.dataFormat,(long)pvVar4 + 1);
    iVar3 = *pvVar1;
    if (iVar3 != -1) {
      if (*(int *)&in_RDI[1].super_HighFreqSub._vptr_HighFreqSub < 0) {
        std::operator<<((ostream *)&std::cerr,
                        "AnalogConsumer error: User requested interleaved data but id byte location not set\n"
                       );
        *(undefined4 *)&in_RDI[1].super_HighFreqSub._vptr_HighFreqSub = 0;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(iVar3,CONCAT13((char)(1 << ((byte)iVar3 & 0x1f)),
                                         CONCAT12(in_stack_ffffffffffffffd2,
                                                  in_stack_ffffffffffffffd0))),
                 (value_type_conflict1 *)__x);
      in_stack_ffffffffffffffd0 = 0;
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)in_RDI,__x_00);
    }
    __x_00 = pvVar4 + 1;
  }
  HFSubConsumer::initialize(in_RDI);
  return;
}

Assistant:

void AnalogConsumer::initialize(){
    //Get interleaved byte location
    il_byte_loc = args.indices.front();
    args.indices.erase(args.indices.begin());

    //Create masks for recognizing which interleaved data user wants
    for(size_t i = 0; i < args.indices.size(); i+=2){
//        int byte = args.indices[i];
        int bit = args.indices[i+1];
        if(bit == -1) continue; //Ignore everything if not interleaved
        if(il_byte_loc < 0){
            //if il byte location is not set, but user wants il data
            std::cerr << "AnalogConsumer error: User requested interleaved data but id byte location not set\n";
            il_byte_loc = 0; // TODO: let user handle error
        }
        uint8_t m = 0;
        m |= 1 << bit; //set the id bit
        il_id_masks.push_back(m);
        prev_interleaved.push_back(0); //set prev interleaved value
    }
    HFSubConsumer::initialize();
}